

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O0

ktx_size_t ktxTexture_layerSize(ktxTexture *This,ktx_uint32_t level,ktxFormatVersionEnum fv)

{
  ktxTexture *This_00;
  ktx_size_t kVar1;
  byte in_SIL;
  long in_RDI;
  ktx_size_t layerSize;
  ktx_size_t imageSize;
  ktx_uint32_t blockCountZ;
  ktxTexture_protected *prtctd;
  ktx_uint32_t local_34;
  ktxFormatVersionEnum in_stack_ffffffffffffffe0;
  
  This_00 = *(ktxTexture **)(in_RDI + 0x18);
  if (in_RDI == 0) {
    __assert_fail("This != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture.c"
                  ,0x2b9,
                  "ktx_size_t ktxTexture_layerSize(ktxTexture *, ktx_uint32_t, ktxFormatVersionEnum)"
                 );
  }
  if (This_00->baseDepth == 0) {
    __assert_fail("prtctd->_formatSize.blockDepth != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture.c"
                  ,0x2ba,
                  "ktx_size_t ktxTexture_layerSize(ktxTexture *, ktx_uint32_t, ktxFormatVersionEnum)"
                 );
  }
  local_34 = (((*(uint *)(in_RDI + 0x2c) >> (in_SIL & 0x1f)) + This_00->baseDepth) - 1) /
             This_00->baseDepth;
  if (local_34 == 0) {
    local_34 = 1;
  }
  kVar1 = ktxTexture_calcImageSize(This_00,local_34,in_stack_ffffffffffffffe0);
  return kVar1 * local_34 * (ulong)*(uint *)(in_RDI + 0x3c);
}

Assistant:

ktx_size_t
ktxTexture_layerSize(ktxTexture* This, ktx_uint32_t level,
                    ktxFormatVersionEnum fv)
{
    /*
     * As there are no 3D cubemaps, the image's z block count will always be
     * 1 for cubemaps and numFaces will always be 1 for 3D textures so the
     * multiply is safe. 3D cubemaps, if they existed, would require
     * imageSize * (blockCount.z + This->numFaces);
     */
    DECLARE_PROTECTED(ktxTexture);
    ktx_uint32_t blockCountZ;
    ktx_size_t imageSize, layerSize;

    assert (This != NULL);
    assert (prtctd->_formatSize.blockDepth != 0);

    blockCountZ = ((This->baseDepth >> level) + prtctd->_formatSize.blockDepth - 1) / prtctd->_formatSize.blockDepth;
    blockCountZ = MAX(1, blockCountZ);
    imageSize = ktxTexture_calcImageSize(This, level, fv);
    layerSize = imageSize * blockCountZ;
    if (fv == KTX_FORMAT_VERSION_ONE && KTX_GL_UNPACK_ALIGNMENT != 4) {
        if (This->isCubemap && !This->isArray) {
            /* cubePadding. NOTE: this adds padding after the last face too. */
            layerSize += _KTX_PAD4(layerSize);
        }
    }
    return layerSize * This->numFaces;
}